

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O2

void __thiscall helics::Publication::publish(Publication *this,NamedPoint *np)

{
  ValueFederate *pVVar1;
  bool bVar2;
  SmallBuffer db;
  data_view local_a0;
  SmallBuffer local_80;
  
  pVVar1 = this->fed;
  if (this->changeDetectionEnabled == true) {
    bVar2 = changeDetected(&this->prevValue,np,this->delta);
    if (!bVar2) {
      return;
    }
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)&this->prevValue,np);
  }
  if (pVVar1 != (ValueFederate *)0x0) {
    typeConvert(&local_80,this->pubType,np);
    local_a0.dblock._M_len = local_80.bufferSize;
    local_a0.dblock._M_str = (char *)local_80.heap;
    local_a0.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_a0.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    helics::ValueFederate::publishBytes(this->fed,this,&local_a0);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_a0.ref.
                super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    SmallBuffer::~SmallBuffer(&local_80);
  }
  return;
}

Assistant:

void Publication::publish(const NamedPoint& np)
{
    bool doPublish = (fed != nullptr);
    if (changeDetectionEnabled) {
        if (changeDetected(prevValue, np, delta)) {
            prevValue = np;
        } else {
            doPublish = false;
        }
    }
    if (doPublish) {
        auto db = typeConvert(pubType, np);
        fed->publishBytes(*this, db);
    }
}